

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O3

float GD::compute_update<false,false,true,false,false,0ul,0ul,0ul>(gd *g,example *ec)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  vw *pvVar4;
  shared_data *psVar5;
  float extraout_XMM0_Da;
  float fVar6;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  double dVar7;
  float fVar8;
  
  pvVar4 = g->all;
  uVar1 = (ec->l).multi.label;
  ec->updated_prediction = (float)(ec->pred).multiclass;
  (*pvVar4->loss->_vptr_loss_function[1])
            ((ulong)(ec->pred).multiclass,(ulong)uVar1,pvVar4->loss,pvVar4->sd);
  fVar8 = 0.0;
  if (0.0 < extraout_XMM0_Da) {
    fVar8 = ec->weight;
    fVar2 = g->all->eta;
    psVar5 = g->all->sd;
    fVar3 = ec->total_sum_feat_sq;
    fVar6 = powf((float)(((double)fVar8 + psVar5->t) - psVar5->weighted_holdout_examples),
                 g->neg_power_t);
    (*pvVar4->loss->_vptr_loss_function[3])
              ((ulong)(ec->pred).multiclass,(ulong)(ec->l).multi.label,
               (ulong)(uint)(fVar8 * fVar2 * fVar6));
    ec->updated_prediction = fVar3 * extraout_XMM0_Da_00 + ec->updated_prediction;
    fVar8 = extraout_XMM0_Da_00;
    if ((pvVar4->reg_mode != 0) && (1e-08 < ABS(extraout_XMM0_Da_00))) {
      (*pvVar4->loss->_vptr_loss_function[6])
                ((ulong)(ec->pred).multiclass,(ulong)(ec->l).multi.label,pvVar4->loss,pvVar4->sd);
      dVar7 = (double)extraout_XMM0_Da_01;
      if (1e-08 <= ABS(dVar7) && ABS(dVar7) != 1e-08) {
        pvVar4->sd->contraction =
             (1.0 - (double)pvVar4->l2_lambda * ((double)-extraout_XMM0_Da_00 / dVar7)) *
             pvVar4->sd->contraction;
      }
      psVar5 = pvVar4->sd;
      fVar8 = extraout_XMM0_Da_00 / (float)psVar5->contraction;
      psVar5->gravity =
           (double)(-(ulong)(1e-08 < ABS(dVar7)) & (ulong)((double)-extraout_XMM0_Da_00 / dVar7)) *
           (double)pvVar4->l1_lambda + psVar5->gravity;
    }
  }
  return fVar8;
}

Assistant:

float compute_update(gd& g, example& ec)
{
  // invariant: not a test label, importance weight > 0
  label_data& ld = ec.l.simple;
  vw& all = *g.all;

  float update = 0.;
  ec.updated_prediction = ec.pred.scalar;
  if (all.loss->getLoss(all.sd, ec.pred.scalar, ld.label) > 0.)
  {
    float pred_per_update = sensitivity<sqrt_rate, feature_mask_off, adax, adaptive, normalized, spare, false>(g, ec);
    float update_scale = get_scale<adaptive>(g, ec, ec.weight);
    if (invariant)
      update = all.loss->getUpdate(ec.pred.scalar, ld.label, update_scale, pred_per_update);
    else
      update = all.loss->getUnsafeUpdate(ec.pred.scalar, ld.label, update_scale);
    // changed from ec.partial_prediction to ld.prediction
    ec.updated_prediction += pred_per_update * update;

    if (all.reg_mode && fabs(update) > 1e-8)
    {
      double dev1 = all.loss->first_derivative(all.sd, ec.pred.scalar, ld.label);
      double eta_bar = (fabs(dev1) > 1e-8) ? (-update / dev1) : 0.0;
      if (fabs(dev1) > 1e-8)
        all.sd->contraction *= (1. - all.l2_lambda * eta_bar);
      update /= (float)all.sd->contraction;
      all.sd->gravity += eta_bar * all.l1_lambda;
    }
  }

  if (sparse_l2)
    update -= g.sparse_l2 * ec.pred.scalar;

  return update;
}